

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLeSample> * __thiscall
pbrt::DistantLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,DistantLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined8 uVar6;
  Float aFVar8 [4];
  float fVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar21 [56];
  undefined1 auVar20 [64];
  undefined1 auVar22 [16];
  undefined1 auVar24 [56];
  undefined1 auVar23 [64];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [16];
  float fVar40;
  SampledSpectrum SVar41;
  float local_58;
  float fStack_54;
  
  auVar18._0_4_ = u1.super_Tuple2<pbrt::Point2,_float>.x + u1.super_Tuple2<pbrt::Point2,_float>.x;
  auVar18._4_4_ = u1.super_Tuple2<pbrt::Point2,_float>.y + u1.super_Tuple2<pbrt::Point2,_float>.y;
  auVar18._8_4_ = in_register_00001208._0_4_ + in_register_00001208._0_4_;
  auVar18._12_4_ = in_register_00001208._4_4_ + in_register_00001208._4_4_;
  auVar27._8_4_ = 0xbf800000;
  auVar27._0_8_ = 0xbf800000bf800000;
  auVar27._12_4_ = 0xbf800000;
  auVar14 = vaddps_avx512vl(auVar18,auVar27);
  aFVar8 = (this->super_LightBase).renderFromLight.m.m[0];
  auVar27 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1);
  auVar18 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2);
  FVar1 = (this->super_LightBase).renderFromLight.m.m[1][0];
  FVar2 = (this->super_LightBase).renderFromLight.m.m[1][1];
  FVar3 = (this->super_LightBase).renderFromLight.m.m[1][2];
  FVar4 = (this->super_LightBase).renderFromLight.m.m[2][0];
  fVar26 = (this->super_LightBase).renderFromLight.m.m[2][1];
  fVar40 = (this->super_LightBase).renderFromLight.m.m[2][2];
  fVar17 = auVar14._0_4_;
  auVar33 = vmovshdup_avx(auVar14);
  fVar13 = auVar33._0_4_;
  if (fVar17 == 0.0) {
    auVar33 = ZEXT816(0) << 0x40;
    if ((fVar13 == 0.0) && (!NAN(fVar13))) goto LAB_0034a1cc;
  }
  auVar33._8_4_ = 0x7fffffff;
  auVar33._0_8_ = 0x7fffffff7fffffff;
  auVar33._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(auVar14,auVar33);
  auVar16._0_4_ = fVar17 / fVar13;
  auVar16._4_12_ = auVar14._4_12_;
  auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar16,ZEXT416(0x3fc90fdb));
  auVar33 = vshufps_avx(auVar15,auVar15,0xf5);
  bVar10 = auVar33._0_4_ < auVar15._0_4_;
  fVar12 = (float)((uint)bVar10 * (int)((fVar13 / fVar17) * 0.7853982) +
                  (uint)!bVar10 * auVar14._0_4_);
  fVar13 = (float)((uint)bVar10 * (int)fVar17 + (uint)!bVar10 * (int)fVar13);
  fVar17 = cosf(fVar12);
  fVar12 = sinf(fVar12);
  auVar33 = vinsertps_avx(ZEXT416((uint)(fVar13 * fVar17)),ZEXT416((uint)(fVar13 * fVar12)),0x10);
LAB_0034a1cc:
  fVar13 = this->scale;
  auVar14 = vinsertps_avx((undefined1  [16])aFVar8,ZEXT416((uint)FVar1),0x10);
  auVar27 = vinsertps_avx(auVar27,ZEXT416((uint)FVar2),0x10);
  auVar15._0_4_ = auVar27._0_4_ * 0.0;
  auVar15._4_4_ = auVar27._4_4_ * 0.0;
  auVar15._8_4_ = auVar27._8_4_ * 0.0;
  auVar15._12_4_ = auVar27._12_4_ * 0.0;
  auVar14 = vfmadd213ps_fma(auVar14,ZEXT816(0) << 0x40,auVar15);
  auVar27 = vinsertps_avx(auVar18,ZEXT416((uint)FVar3),0x10);
  auVar18 = vfmadd213ss_fma(ZEXT416((uint)FVar4),ZEXT416(0) << 0x40,ZEXT416((uint)(fVar26 * 0.0)));
  auVar19._0_4_ = auVar27._0_4_ + auVar14._0_4_;
  auVar19._4_4_ = auVar27._4_4_ + auVar14._4_4_;
  auVar19._8_4_ = auVar27._8_4_ + auVar14._8_4_;
  auVar19._12_4_ = auVar27._12_4_ + auVar14._12_4_;
  fVar40 = fVar40 + auVar18._0_4_;
  uVar5 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar7 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  auVar30._0_4_ = auVar19._0_4_ * auVar19._0_4_;
  auVar30._4_4_ = auVar19._4_4_ * auVar19._4_4_;
  auVar30._8_4_ = auVar19._8_4_ * auVar19._8_4_;
  auVar30._12_4_ = auVar19._12_4_ * auVar19._12_4_;
  auVar27 = vhaddps_avx(auVar30,auVar30);
  auVar27 = ZEXT416((uint)(auVar27._0_4_ + fVar40 * fVar40));
  auVar27 = vsqrtss_avx(auVar27,auVar27);
  fVar26 = auVar27._0_4_;
  fVar40 = fVar40 / fVar26;
  auVar31._4_4_ = fVar26;
  auVar31._0_4_ = fVar26;
  auVar31._8_4_ = fVar26;
  auVar31._12_4_ = fVar26;
  fVar26 = this->sceneRadius;
  auVar27 = vdivps_avx(auVar19,auVar31);
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  auVar32._8_4_ = 0x80000000;
  auVar32._0_8_ = 0x8000000080000000;
  auVar32._12_4_ = 0x80000000;
  auVar15 = vpternlogd_avx512vl(auVar14,ZEXT416((uint)fVar40),auVar32,0xf8);
  auVar24 = (undefined1  [56])0x0;
  fVar11 = auVar15._0_4_;
  fVar35 = auVar27._0_4_;
  fVar9 = auVar33._0_4_;
  auVar25._0_4_ = fVar35 * fVar9;
  fVar37 = auVar27._4_4_;
  auVar25._4_4_ = fVar37 * auVar33._4_4_;
  fVar38 = auVar27._8_4_;
  auVar25._8_4_ = fVar38 * auVar33._8_4_;
  fVar39 = auVar27._12_4_;
  auVar25._12_4_ = fVar39 * auVar33._12_4_;
  auVar14 = vmovshdup_avx(auVar25);
  fVar17 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar21 = (undefined1  [56])0x0;
  SVar41 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar23._0_8_ = SVar41.values.values._8_8_;
  auVar23._8_56_ = auVar24;
  auVar20._0_8_ = SVar41.values.values._0_8_;
  auVar20._8_56_ = auVar21;
  auVar18 = vmovlhps_avx(auVar20._0_16_,auVar23._0_16_);
  auVar22._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
  auVar22._8_4_ = -fVar38;
  auVar22._12_4_ = -fVar39;
  auVar28._0_4_ = -1.0 / (fVar11 + fVar40);
  auVar27 = vmovshdup_avx(auVar27);
  fVar12 = fVar35 * auVar27._0_4_ * auVar28._0_4_;
  auVar28._4_4_ = auVar28._0_4_;
  auVar28._8_4_ = auVar28._0_4_;
  auVar28._12_4_ = auVar28._0_4_;
  auVar16 = vpermi2ps_avx512vl(_DAT_02865280,ZEXT416((uint)(fVar11 * fVar12)),ZEXT416((uint)fVar12))
  ;
  auVar27 = vshufps_avx(auVar33,auVar33,0xe1);
  auVar36._8_4_ = 0x3f800000;
  auVar36._0_8_ = 0x3f8000003f800000;
  auVar36._12_4_ = 0x3f800000;
  auVar34._0_4_ = fVar35 * fVar35 * fVar11;
  auVar34._4_4_ = fVar37 * 0.0;
  auVar34._8_4_ = fVar38 * 0.0;
  auVar34._12_4_ = fVar39 * 0.0;
  auVar15 = vunpcklps_avx(auVar36,auVar15);
  auVar15 = vfmadd231ps_fma(auVar15,auVar34,auVar28);
  auVar29._0_4_ =
       fVar35 * fVar26 +
       fVar26 * (fVar35 * 0.0 + auVar16._0_4_ * auVar27._0_4_ + fVar9 * auVar15._0_4_) +
       (float)uVar5;
  auVar29._4_4_ =
       fVar37 * fVar26 +
       fVar26 * (fVar37 * 0.0 + auVar16._4_4_ * auVar27._4_4_ + auVar33._4_4_ * auVar15._4_4_) +
       (float)uVar7;
  auVar29._8_4_ =
       fVar38 * fVar26 +
       fVar26 * (fVar38 * 0.0 + auVar16._8_4_ * auVar27._8_4_ + auVar33._8_4_ * auVar15._8_4_) + 0.0
  ;
  auVar29._12_4_ =
       fVar39 * fVar26 +
       fVar26 * (fVar39 * 0.0 + auVar16._12_4_ * auVar27._12_4_ + auVar33._12_4_ * auVar15._12_4_) +
       0.0;
  fVar12 = this->sceneRadius;
  __return_storage_ptr__->set = true;
  *(float *)&__return_storage_ptr__->optionalValue = auVar18._0_4_ * fVar13;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = auVar18._4_4_ * fVar13;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = auVar18._8_4_ * fVar13;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = auVar18._12_4_ * fVar13;
  uVar6 = vmovlps_avx(auVar29);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar6;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       fVar40 * fVar26 +
       fVar26 * (fVar40 * 0.0 + (fVar35 * -fVar11 * fVar9 - auVar14._0_4_)) + fVar17;
  uVar6 = vmovlps_avx(auVar22);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar6;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = -fVar40;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = time;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
       1.0 / (fVar12 * fVar12 * 3.1415927);
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x94) = 0x3f800000;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> DistantLight::SampleLe(Point2f u1, Point2f u2,
                                                     SampledWavelengths &lambda,
                                                     Float time) const {
    // Choose point on disk oriented toward infinite light direction
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Frame wFrame = Frame::FromZ(w);
    Point2f cd = SampleUniformDiskConcentric(u1);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));

    // Compute _DistantLight_ light ray
    Ray ray(pDisk + sceneRadius * w, -w, time);

    return LightLeSample(scale * Lemit.Sample(lambda), ray, 1 / (Pi * Sqr(sceneRadius)),
                         1);
}